

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O0

void Pln_ManPrintFinal(Pln_Man_t *p,int fVerbose,int fVeryVerbose)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  uint local_34;
  int Count;
  int iConst;
  int iMono;
  int Entry;
  int k;
  Vec_Int_t *vArray;
  int fVeryVerbose_local;
  int fVerbose_local;
  Pln_Man_t *p_local;
  
  local_34 = 0;
  for (Count = 0; iVar2 = Vec_IntSize(p->vCoefs), Count < iVar2; Count = Count + 1) {
    iVar2 = Vec_IntEntry(p->vCoefs,Count);
    if (((iVar2 != 0) && (local_34 = local_34 + 1, fVerbose != 0)) && ((int)local_34 < 0x1a)) {
      pVVar5 = Hsh_VecReadEntry(p->pHashC,iVar2);
      for (iMono = 0; iVar2 = Vec_IntSize(pVVar5), iMono < iVar2; iMono = iMono + 1) {
        iVar2 = Vec_IntEntry(pVVar5,iMono);
        pcVar1 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +";
        if (iVar2 < 0) {
          pcVar1 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -";
        }
        iVar2 = Abc_AbsInt(iVar2);
        printf("%s%d",pcVar1 + 0x4a,(ulong)(uint)(1 << ((char)iVar2 - 1U & 0x1f)));
      }
      pVVar5 = Hsh_VecReadEntry(p->pHashM,Count);
      for (iMono = 0; iVar2 = Vec_IntSize(pVVar5), iMono < iVar2; iMono = iMono + 1) {
        uVar3 = Vec_IntEntry(pVVar5,iMono);
        printf(" * %d",(ulong)uVar3);
      }
      printf("\n");
    }
  }
  uVar3 = Hsh_VecSize(p->pHashC);
  uVar4 = Hsh_VecSize(p->pHashM);
  printf("HashC = %d. HashM = %d.  Total = %d. Used = %d.\n",(ulong)uVar3,(ulong)uVar4,
         (ulong)(uint)p->nBuilds,(ulong)local_34);
  return;
}

Assistant:

void Pln_ManPrintFinal( Pln_Man_t * p, int fVerbose, int fVeryVerbose )
{
    Vec_Int_t * vArray;
    int k, Entry, iMono, iConst, Count = 0;
    Vec_IntForEachEntry( p->vCoefs, iConst, iMono )
    {
        if ( iConst == 0 ) 
            continue;

        Count++;

        if ( !fVerbose )
            continue;

        if ( Count > 25 )
            continue;

        vArray = Hsh_VecReadEntry( p->pHashC, iConst );
        Vec_IntForEachEntry( vArray, Entry, k )
            printf( "%s%d", Entry < 0 ? "-" : "+", (1 << (Abc_AbsInt(Entry)-1)) );

        vArray = Hsh_VecReadEntry( p->pHashM, iMono );
        Vec_IntForEachEntry( vArray, Entry, k )
            printf( " * %d", Entry );
        printf( "\n" );
    }
    printf( "HashC = %d. HashM = %d.  Total = %d. Used = %d.\n", Hsh_VecSize(p->pHashC), Hsh_VecSize(p->pHashM), p->nBuilds, Count );
}